

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDualRow.cpp
# Opt level: O2

void __thiscall HDualRow::update_dual(HDualRow *this,double theta)

{
  int iVar1;
  HModel *pHVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer piVar5;
  undefined8 uVar6;
  undefined1 auVar7 [12];
  undefined4 uVar8;
  ulong uVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  
  uVar6 = rdtsc();
  uVar8 = (undefined4)((ulong)uVar6 >> 0x20);
  auVar7._4_4_ = uVar8;
  auVar7._0_4_ = uVar8;
  auVar7._8_4_ = 0;
  auVar11._0_12_ = auVar7 << 0x20;
  auVar11._12_4_ = 0x45300000;
  (this->workModel->timer).itemStart[0x15] =
       (auVar11._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0);
  pHVar2 = this->workModel;
  pdVar3 = (pHVar2->workDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (this->packValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar5 = (this->packIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar10 = 0;
  uVar9 = (ulong)(uint)this->packCount;
  if (this->packCount < 1) {
    uVar9 = uVar10;
  }
  for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
    iVar1 = piVar5[uVar10];
    pdVar3[iVar1] = pdVar4[uVar10] * -theta + pdVar3[iVar1];
  }
  HTimer::recordFinish(&pHVar2->timer,0x15);
  return;
}

Assistant:

void HDualRow::update_dual(double theta) {
    workModel->timer.recordStart(HTICK_UPDATE_DUAL);
    double *workDual = workModel->getWorkDual();
    for (int i = 0; i < packCount; i++)
        workDual[packIndex[i]] -= theta * packValue[i];
    workModel->timer.recordFinish(HTICK_UPDATE_DUAL);
}